

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v11::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  basic_string_view<char> rhs;
  basic_string_view<char> lhs;
  bool bVar1;
  uint uVar2;
  long in_RDX;
  long lVar3;
  ulong in_RSI;
  char *in_RDI;
  rgb color;
  int i;
  size_t index;
  uint32_t value;
  bool is_background;
  undefined1 in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffa9;
  uint8_t in_stack_ffffffffffffffaa;
  uint8_t in_stack_ffffffffffffffab;
  undefined4 in_stack_ffffffffffffffac;
  int iVar4;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  uint32_t uStack_4;
  
  if ((in_RSI & 1) == 0) {
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)
               CONCAT44(in_stack_ffffffffffffffac,
                        CONCAT13(in_stack_ffffffffffffffab,
                                 CONCAT12(in_stack_ffffffffffffffaa,
                                          CONCAT11(in_stack_ffffffffffffffa9,
                                                   in_stack_ffffffffffffffa8)))),in_RDI);
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)
               CONCAT44(in_stack_ffffffffffffffac,
                        CONCAT13(in_stack_ffffffffffffffab,
                                 CONCAT12(in_stack_ffffffffffffffaa,
                                          CONCAT11(in_stack_ffffffffffffffa9,
                                                   in_stack_ffffffffffffffa8)))),in_RDI);
    lhs.data_._4_4_ = in_stack_ffffffffffffffbc;
    lhs.data_._0_4_ = in_stack_ffffffffffffffb8;
    lhs.size_ = in_stack_ffffffffffffffc0;
    rhs.data_._1_1_ = in_stack_ffffffffffffffa9;
    rhs.data_._0_1_ = in_stack_ffffffffffffffa8;
    rhs.data_._2_1_ = in_stack_ffffffffffffffaa;
    rhs.data_._3_1_ = in_stack_ffffffffffffffab;
    rhs.data_._4_4_ = in_stack_ffffffffffffffac;
    rhs.size_ = in_stack_ffffffffffffffb0;
    bVar1 = v11::operator==(lhs,rhs);
    uStack_4._0_1_ = (byte)(in_RSI >> 0x20);
    uVar2 = (uint)(byte)uStack_4;
    if (bVar1) {
      uVar2 = uVar2 + 10;
    }
    *in_RDI = '\x1b';
    lVar3 = 2;
    in_RDI[1] = '[';
    if (99 < uVar2) {
      lVar3 = 3;
      in_RDI[2] = '1';
      uVar2 = uVar2 % 100;
    }
    in_RDI[lVar3] = (char)((ulong)uVar2 / 10) + '0';
    in_RDI[lVar3 + 1] = (char)((ulong)uVar2 % 10) + '0';
    in_RDI[lVar3 + 2] = 'm';
    in_RDI[lVar3 + 3] = '\0';
  }
  else {
    for (iVar4 = 0; iVar4 < 7; iVar4 = iVar4 + 1) {
      in_RDI[iVar4] = *(char *)(in_RDX + iVar4);
    }
    uStack_4 = (uint32_t)(in_RSI >> 0x20);
    rgb::rgb((rgb *)&stack0xffffffffffffffa9,uStack_4);
    to_esc(in_stack_ffffffffffffffa9,in_RDI + 7,';');
    to_esc(in_stack_ffffffffffffffaa,in_RDI + 0xb,';');
    to_esc(in_stack_ffffffffffffffab,in_RDI + 0xf,'m');
    in_RDI[0x13] = '\0';
  }
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(color_type text_color,
                                  const char* esc) noexcept {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == string_view("\x1b[48;2;");
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }